

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<wchar_t> * fmt::v11::detail::thousands_sep_impl<wchar_t>(locale_ref loc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  thousands_sep_result<wchar_t> *in_RDI;
  wchar_t thousands_sep;
  string grouping;
  numpunct<wchar_t> *facet;
  wchar_t in_stack_ffffffffffffff80;
  wchar_t wVar2;
  wchar_t wVar3;
  thousands_sep_result<wchar_t> *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  __str = &local_20;
  ptVar4 = in_RDI;
  locale_ref::get<std::locale>((locale_ref *)in_RDI);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::use_facet<std::__cxx11::numpunct<wchar_t>>((locale *)__str);
  std::locale::~locale((locale *)&local_20);
  local_20._M_string_length = (size_type)this;
  std::__cxx11::numpunct<wchar_t>::grouping();
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xafd233);
  if (bVar1) {
    wVar2 = L'\0';
  }
  else {
    in_stack_ffffffffffffff80 = std::__cxx11::numpunct<wchar_t>::thousands_sep();
    wVar2 = in_stack_ffffffffffffff80;
  }
  wVar3 = wVar2;
  std::__cxx11::string::string(this,__str);
  ptVar4->thousands_sep = wVar2;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(wVar3,in_stack_ffffffffffffff80));
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto&& facet = use_facet<numpunct<Char>>(loc.get<locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}